

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

void embree::avx::OrientedDiscMiMBIntersectorK<4,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  Scene *pSVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  undefined4 uVar15;
  RayHitK<4> *pRVar16;
  int iVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar37;
  float fVar38;
  undefined1 auVar36 [16];
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [64];
  float fVar47;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar48 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined8 *local_1d8;
  void *local_1d0;
  RTCRayQueryContext *local_1c8;
  RayHitK<4> *local_1c0;
  undefined1 (*local_1b8) [16];
  undefined4 local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  undefined1 local_68 [16];
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint uStack_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  ulong uVar17;
  undefined1 auVar45 [64];
  
  pSVar8 = context->scene;
  uVar17 = (ulong)(Disc->primIDs).field_0.i[0];
  pGVar9 = (pSVar8->geometries).items[Disc->sharedGeomID].ptr;
  fVar1 = (pGVar9->time_range).lower;
  fVar1 = pGVar9->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar9->time_range).upper - fVar1));
  auVar27 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
  auVar27 = vminss_avx(auVar27,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar34 = vmaxss_avx(ZEXT816(0) << 0x20,auVar27);
  iVar18 = (int)auVar34._0_4_;
  lVar20 = *(long *)&pGVar9[2].numPrimitives;
  lVar24 = (long)iVar18 * 0x38;
  lVar25 = *(long *)(lVar20 + lVar24);
  lVar23 = *(long *)(lVar20 + 0x10 + lVar24);
  auVar27 = *(undefined1 (*) [16])(lVar25 + lVar23 * uVar17);
  uVar22 = (ulong)(Disc->primIDs).field_0.i[1];
  auVar33 = *(undefined1 (*) [16])(lVar25 + lVar23 * uVar22);
  uVar19 = (ulong)(Disc->primIDs).field_0.i[2];
  auVar31 = *(undefined1 (*) [16])(lVar25 + lVar23 * uVar19);
  uVar21 = (ulong)(Disc->primIDs).field_0.i[3];
  auVar28 = *(undefined1 (*) [16])(lVar25 + lVar23 * uVar21);
  p_Var10 = pGVar9[2].intersectionFilterN;
  lVar25 = *(long *)(p_Var10 + lVar24);
  lVar23 = *(long *)(p_Var10 + lVar24 + 0x10);
  auVar32 = *(undefined1 (*) [16])(lVar25 + lVar23 * uVar17);
  auVar29 = *(undefined1 (*) [16])(lVar25 + lVar23 * uVar22);
  auVar36 = *(undefined1 (*) [16])(lVar25 + lVar23 * uVar19);
  auVar41 = *(undefined1 (*) [16])(lVar25 + lVar23 * uVar21);
  lVar23 = (long)(iVar18 + 1) * 0x38;
  lVar25 = *(long *)(lVar20 + lVar23);
  lVar20 = *(long *)(lVar20 + 0x10 + lVar23);
  auVar42 = *(undefined1 (*) [16])(lVar25 + lVar20 * uVar17);
  auVar40 = *(undefined1 (*) [16])(lVar25 + lVar20 * uVar22);
  auVar56 = *(undefined1 (*) [16])(lVar25 + lVar20 * uVar19);
  auVar57 = *(undefined1 (*) [16])(lVar25 + lVar20 * uVar21);
  lVar20 = *(long *)(p_Var10 + lVar23);
  lVar25 = *(long *)(p_Var10 + lVar23 + 0x10);
  auVar53 = *(undefined1 (*) [16])(lVar20 + uVar17 * lVar25);
  auVar30 = *(undefined1 (*) [16])(lVar20 + uVar22 * lVar25);
  fVar1 = fVar1 - auVar34._0_4_;
  auVar43 = vunpcklps_avx(auVar27,auVar31);
  auVar34 = vunpckhps_avx(auVar27,auVar31);
  auVar27 = vunpcklps_avx(auVar33,auVar28);
  local_218 = vunpckhps_avx(auVar33,auVar28);
  auVar44 = vunpcklps_avx(auVar43,auVar27);
  auVar31 = vunpckhps_avx(auVar43,auVar27);
  auVar43 = vunpcklps_avx(auVar32,auVar36);
  auVar33 = vunpckhps_avx(auVar32,auVar36);
  auVar32 = vunpcklps_avx(auVar29,auVar41);
  auVar28 = vunpckhps_avx(auVar29,auVar41);
  auVar27 = *(undefined1 (*) [16])(lVar20 + uVar19 * lVar25);
  auVar41 = vunpcklps_avx(auVar33,auVar28);
  auVar12 = vunpcklps_avx(auVar43,auVar32);
  auVar28 = vunpckhps_avx(auVar43,auVar32);
  auVar33 = vunpcklps_avx(auVar42,auVar56);
  auVar29 = vunpckhps_avx(auVar42,auVar56);
  auVar32 = vunpcklps_avx(auVar40,auVar57);
  local_e8 = vunpckhps_avx(auVar40,auVar57);
  auVar42 = vunpcklps_avx(auVar33,auVar32);
  auVar32 = vunpckhps_avx(auVar33,auVar32);
  auVar36 = vunpcklps_avx(auVar53,auVar27);
  auVar33 = vunpckhps_avx(auVar53,auVar27);
  auVar27 = *(undefined1 (*) [16])(lVar20 + lVar25 * uVar21);
  auVar40 = vunpcklps_avx(auVar30,auVar27);
  auVar27 = vunpckhps_avx(auVar30,auVar27);
  auVar56 = vunpcklps_avx(auVar33,auVar27);
  auVar57 = vunpcklps_avx(auVar36,auVar40);
  auVar36 = vunpckhps_avx(auVar36,auVar40);
  auVar27 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
  auVar33 = vshufps_avx(ZEXT416((uint)(1.0 - fVar1)),ZEXT416((uint)(1.0 - fVar1)),0);
  fVar47 = auVar27._0_4_;
  fVar49 = auVar27._4_4_;
  fVar50 = auVar27._8_4_;
  fVar51 = auVar27._12_4_;
  fVar35 = auVar33._0_4_;
  fVar37 = auVar33._4_4_;
  fVar38 = auVar33._8_4_;
  fVar39 = auVar33._12_4_;
  auVar40._0_4_ = fVar35 * auVar44._0_4_ + fVar47 * auVar42._0_4_;
  auVar40._4_4_ = fVar37 * auVar44._4_4_ + fVar49 * auVar42._4_4_;
  auVar40._8_4_ = fVar38 * auVar44._8_4_ + fVar50 * auVar42._8_4_;
  auVar40._12_4_ = fVar39 * auVar44._12_4_ + fVar51 * auVar42._12_4_;
  auVar53._0_4_ = fVar35 * auVar31._0_4_ + fVar47 * auVar32._0_4_;
  auVar53._4_4_ = fVar37 * auVar31._4_4_ + fVar49 * auVar32._4_4_;
  auVar53._8_4_ = fVar38 * auVar31._8_4_ + fVar50 * auVar32._8_4_;
  auVar53._12_4_ = fVar39 * auVar31._12_4_ + fVar51 * auVar32._12_4_;
  local_f8 = fVar35 * auVar12._0_4_ + fVar47 * auVar57._0_4_;
  fStack_f4 = fVar37 * auVar12._4_4_ + fVar49 * auVar57._4_4_;
  fStack_f0 = fVar38 * auVar12._8_4_ + fVar50 * auVar57._8_4_;
  fStack_ec = fVar39 * auVar12._12_4_ + fVar51 * auVar57._12_4_;
  local_1f8._0_4_ = auVar28._0_4_;
  local_1f8._4_4_ = auVar28._4_4_;
  fStack_1f0 = auVar28._8_4_;
  fStack_1ec = auVar28._12_4_;
  local_108 = fVar35 * (float)local_1f8._0_4_ + fVar47 * auVar36._0_4_;
  fStack_104 = fVar37 * (float)local_1f8._4_4_ + fVar49 * auVar36._4_4_;
  fStack_100 = fVar38 * fStack_1f0 + fVar50 * auVar36._8_4_;
  fStack_fc = fVar39 * fStack_1ec + fVar51 * auVar36._12_4_;
  local_1e8._0_4_ = auVar41._0_4_;
  local_1e8._4_4_ = auVar41._4_4_;
  fStack_1e0 = auVar41._8_4_;
  fStack_1dc = auVar41._12_4_;
  local_118 = fVar35 * (float)local_1e8._0_4_ + fVar47 * auVar56._0_4_;
  fStack_114 = fVar37 * (float)local_1e8._4_4_ + fVar49 * auVar56._4_4_;
  fStack_110 = fVar38 * fStack_1e0 + fVar50 * auVar56._8_4_;
  fStack_10c = fVar39 * fStack_1dc + fVar51 * auVar56._12_4_;
  local_d8 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  fVar3 = *(float *)(ray + k * 4 + 0x60);
  auVar27._0_4_ = fVar1 * local_f8 + local_108 * fVar2 + local_118 * fVar3;
  auVar27._4_4_ = fVar1 * fStack_f4 + fStack_104 * fVar2 + fStack_114 * fVar3;
  auVar27._8_4_ = fVar1 * fStack_f0 + fStack_100 * fVar2 + fStack_110 * fVar3;
  auVar27._12_4_ = fVar1 * fStack_ec + fStack_fc * fVar2 + fStack_10c * fVar3;
  auVar33 = vcmpps_avx(auVar27,ZEXT416(0) << 0x20,4);
  auVar31._8_4_ = 0x3f800000;
  auVar31._0_8_ = &DAT_3f8000003f800000;
  auVar31._12_4_ = 0x3f800000;
  auVar27 = vblendvps_avx(auVar31,auVar27,auVar33);
  auVar31 = vunpcklps_avx(auVar29,local_e8);
  auVar28 = vunpcklps_avx(auVar34,local_218);
  auVar56._0_4_ = fVar35 * auVar28._0_4_ + fVar47 * auVar31._0_4_;
  auVar56._4_4_ = fVar37 * auVar28._4_4_ + fVar49 * auVar31._4_4_;
  auVar56._8_4_ = fVar38 * auVar28._8_4_ + fVar50 * auVar31._8_4_;
  auVar56._12_4_ = fVar39 * auVar28._12_4_ + fVar51 * auVar31._12_4_;
  fVar4 = *(float *)(ray + k * 4 + 0x20);
  auVar57._4_4_ = fVar4;
  auVar57._0_4_ = fVar4;
  auVar57._8_4_ = fVar4;
  auVar57._12_4_ = fVar4;
  auVar31 = vsubps_avx(auVar56,auVar57);
  fVar5 = *(float *)(ray + k * 4 + 0x10);
  auVar28._4_4_ = fVar5;
  auVar28._0_4_ = fVar5;
  auVar28._8_4_ = fVar5;
  auVar28._12_4_ = fVar5;
  auVar28 = vsubps_avx(auVar53,auVar28);
  fVar6 = *(float *)(ray + k * 4);
  auVar32._4_4_ = fVar6;
  auVar32._0_4_ = fVar6;
  auVar32._8_4_ = fVar6;
  auVar32._12_4_ = fVar6;
  auVar32 = vsubps_avx(auVar40,auVar32);
  auVar41._0_4_ = auVar32._0_4_ * local_f8 + local_108 * auVar28._0_4_ + local_118 * auVar31._0_4_;
  auVar41._4_4_ =
       auVar32._4_4_ * fStack_f4 + fStack_104 * auVar28._4_4_ + fStack_114 * auVar31._4_4_;
  auVar41._8_4_ =
       auVar32._8_4_ * fStack_f0 + fStack_100 * auVar28._8_4_ + fStack_110 * auVar31._8_4_;
  auVar41._12_4_ =
       auVar32._12_4_ * fStack_ec + fStack_fc * auVar28._12_4_ + fStack_10c * auVar31._12_4_;
  local_158 = vdivps_avx(auVar41,auVar27);
  auVar46 = ZEXT1664(local_158);
  uVar15 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar36._4_4_ = uVar15;
  auVar36._0_4_ = uVar15;
  auVar36._8_4_ = uVar15;
  auVar36._12_4_ = uVar15;
  auVar27 = vcmpps_avx(auVar36,local_158,2);
  uVar15 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar42._4_4_ = uVar15;
  auVar42._0_4_ = uVar15;
  auVar42._8_4_ = uVar15;
  auVar42._12_4_ = uVar15;
  auVar31 = vcmpps_avx(local_158,auVar42,2);
  auVar27 = vandps_avx(auVar31,auVar27);
  auVar31 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar31 = vpcmpgtd_avx(auVar31,_DAT_01ff0cf0);
  auVar27 = vandps_avx(auVar27,auVar31);
  auVar31 = auVar33 & auVar27;
  if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0') {
    auVar27 = vandps_avx(auVar27,auVar33);
    auVar33 = vunpckhps_avx(auVar34,local_218);
    auVar31 = vunpckhps_avx(auVar29,local_e8);
    fVar35 = fVar35 * auVar33._0_4_ + fVar47 * auVar31._0_4_;
    fVar37 = fVar37 * auVar33._4_4_ + fVar49 * auVar31._4_4_;
    fVar38 = fVar38 * auVar33._8_4_ + fVar50 * auVar31._8_4_;
    fVar39 = fVar39 * auVar33._12_4_ + fVar51 * auVar31._12_4_;
    fVar47 = local_158._0_4_;
    fVar49 = local_158._4_4_;
    fVar50 = local_158._8_4_;
    fVar51 = local_158._12_4_;
    auVar33._0_4_ = fVar6 + fVar1 * fVar47;
    auVar33._4_4_ = fVar6 + fVar1 * fVar49;
    auVar33._8_4_ = fVar6 + fVar1 * fVar50;
    auVar33._12_4_ = fVar6 + fVar1 * fVar51;
    auVar29._0_4_ = fVar5 + fVar2 * fVar47;
    auVar29._4_4_ = fVar5 + fVar2 * fVar49;
    auVar29._8_4_ = fVar5 + fVar2 * fVar50;
    auVar29._12_4_ = fVar5 + fVar2 * fVar51;
    auVar43._0_4_ = fVar4 + fVar47 * fVar3;
    auVar43._4_4_ = fVar4 + fVar49 * fVar3;
    auVar43._8_4_ = fVar4 + fVar50 * fVar3;
    auVar43._12_4_ = fVar4 + fVar51 * fVar3;
    auVar33 = vsubps_avx(auVar33,auVar40);
    auVar31 = vsubps_avx(auVar29,auVar53);
    auVar28 = vsubps_avx(auVar43,auVar56);
    auVar30._0_4_ =
         auVar33._0_4_ * auVar33._0_4_ +
         auVar31._0_4_ * auVar31._0_4_ + auVar28._0_4_ * auVar28._0_4_;
    auVar30._4_4_ =
         auVar33._4_4_ * auVar33._4_4_ +
         auVar31._4_4_ * auVar31._4_4_ + auVar28._4_4_ * auVar28._4_4_;
    auVar30._8_4_ =
         auVar33._8_4_ * auVar33._8_4_ +
         auVar31._8_4_ * auVar31._8_4_ + auVar28._8_4_ * auVar28._8_4_;
    auVar30._12_4_ =
         auVar33._12_4_ * auVar33._12_4_ +
         auVar31._12_4_ * auVar31._12_4_ + auVar28._12_4_ * auVar28._12_4_;
    auVar34._0_4_ = fVar35 * fVar35;
    auVar34._4_4_ = fVar37 * fVar37;
    auVar34._8_4_ = fVar38 * fVar38;
    auVar34._12_4_ = fVar39 * fVar39;
    auVar33 = vcmpps_avx(auVar30,auVar34,1);
    auVar31 = auVar27 & auVar33;
    if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0')
    {
      local_228 = vandps_avx(auVar33,auVar27);
      local_178 = ZEXT832(0) << 0x20;
      local_148 = CONCAT44(fStack_f4,local_f8);
      uStack_140 = CONCAT44(fStack_ec,fStack_f0);
      local_138 = CONCAT44(fStack_104,local_108);
      uStack_130 = CONCAT44(fStack_fc,fStack_100);
      local_128 = CONCAT44(fStack_114,local_118);
      uStack_120 = CONCAT44(fStack_10c,fStack_110);
      auVar44._8_4_ = 0x7f800000;
      auVar44._0_8_ = 0x7f8000007f800000;
      auVar44._12_4_ = 0x7f800000;
      auVar45 = ZEXT1664(auVar44);
      auVar27 = vblendvps_avx(auVar44,local_158,local_228);
      auVar33 = vshufps_avx(auVar27,auVar27,0xb1);
      auVar33 = vminps_avx(auVar33,auVar27);
      auVar31 = vshufpd_avx(auVar33,auVar33,1);
      auVar33 = vminps_avx(auVar31,auVar33);
      auVar33 = vcmpps_avx(auVar27,auVar33,0);
      auVar31 = local_228 & auVar33;
      auVar27 = local_228;
      if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar31[0xf] < '\0'
         ) {
        auVar27 = vandps_avx(auVar33,local_228);
      }
      uVar14 = vmovmskps_avx(auVar27);
      lVar20 = 0;
      if (uVar14 != 0) {
        for (; (uVar14 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      lVar25 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar11 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar48 = ZEXT3264(auVar11);
      auVar52 = ZEXT864(0) << 0x20;
      auVar27 = vpcmpeqd_avx(auVar53,auVar53);
      auVar54 = ZEXT1664(auVar27);
      auVar55 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      _local_1f8 = auVar53;
      _local_1e8 = auVar40;
      do {
        local_1b8 = &local_c8;
        local_1d8 = &local_208;
        uVar14 = *(uint *)(local_d8 + lVar20 * 4);
        pRVar16 = (RayHitK<4> *)(ulong)uVar14;
        pGVar9 = (pSVar8->geometries).items[(long)pRVar16].ptr;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_228 + lVar20 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar15 = *(undefined4 *)(local_178 + lVar20 * 4);
            uVar7 = *(undefined4 *)(local_178 + lVar20 * 4 + 0x10);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_158 + lVar20 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)&local_148 + lVar20 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)&local_138 + lVar20 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)((long)&local_128 + lVar20 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar15;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar7;
            *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[lVar20];
            *(uint *)(ray + k * 4 + 0x120) = uVar14;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            return;
          }
          local_98 = *(undefined4 *)(local_178 + lVar20 * 4);
          local_88 = *(undefined4 *)(local_178 + lVar20 * 4 + 0x10);
          local_68 = vpshufd_avx(ZEXT416(uVar14),0);
          local_78 = (Disc->primIDs).field_0.i[lVar20];
          uVar15 = *(undefined4 *)((long)&local_148 + lVar20 * 4);
          local_c8._4_4_ = uVar15;
          local_c8._0_4_ = uVar15;
          local_c8._8_4_ = uVar15;
          local_c8._12_4_ = uVar15;
          uVar15 = *(undefined4 *)((long)&local_138 + lVar20 * 4);
          local_b8._4_4_ = uVar15;
          local_b8._0_4_ = uVar15;
          local_b8._8_4_ = uVar15;
          local_b8._12_4_ = uVar15;
          uVar15 = *(undefined4 *)((long)&local_128 + lVar20 * 4);
          local_a8._4_4_ = uVar15;
          local_a8._0_4_ = uVar15;
          local_a8._8_4_ = uVar15;
          local_a8._12_4_ = uVar15;
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          uStack_84 = local_88;
          uStack_80 = local_88;
          uStack_7c = local_88;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          local_198 = auVar48._0_32_;
          uStack_54 = context->user->instID[0];
          local_58 = uStack_54;
          uStack_50 = uStack_54;
          uStack_4c = uStack_54;
          uStack_48 = context->user->instPrimID[0];
          uStack_44 = uStack_48;
          uStack_40 = uStack_48;
          uStack_3c = uStack_48;
          local_218._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_158 + lVar20 * 4);
          local_208 = *(undefined8 *)(mm_lookupmask_ps + lVar25);
          uStack_200 = *(undefined8 *)(mm_lookupmask_ps + lVar25 + 8);
          local_1d0 = pGVar9->userPtr;
          local_1c8 = context->user;
          local_1b0 = 4;
          pRVar16 = (RayHitK<4> *)pGVar9->intersectionFilterN;
          local_1a8 = auVar46._0_16_;
          auVar27 = auVar55._0_16_;
          local_1c0 = ray;
          if (pRVar16 != (RayHitK<4> *)0x0) {
            auVar33 = auVar54._0_16_;
            pRVar16 = (RayHitK<4> *)(*(code *)pRVar16)(&local_1d8);
            auVar55 = ZEXT1664(auVar27);
            auVar33 = vpcmpeqd_avx(auVar33,auVar33);
            auVar54 = ZEXT1664(auVar33);
            auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar48 = ZEXT3264(local_198);
            auVar45 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            auVar46 = ZEXT1664(local_1a8);
          }
          auVar12._8_8_ = uStack_200;
          auVar12._0_8_ = local_208;
          auVar33 = auVar54._0_16_;
          if (auVar12 == (undefined1  [16])0x0) {
            auVar27 = vpcmpeqd_avx(auVar52._0_16_,(undefined1  [16])0x0);
            auVar33 = auVar33 ^ auVar27;
          }
          else {
            pRVar16 = (RayHitK<4> *)context->args->filter;
            if ((pRVar16 != (RayHitK<4> *)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              pRVar16 = (RayHitK<4> *)(*(code *)pRVar16)(&local_1d8);
              auVar55 = ZEXT1664(auVar27);
              auVar27 = vpcmpeqd_avx(auVar33,auVar33);
              auVar54 = ZEXT1664(auVar27);
              auVar52 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar48 = ZEXT3264(local_198);
              auVar45 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              auVar46 = ZEXT1664(local_1a8);
            }
            auVar13._8_8_ = uStack_200;
            auVar13._0_8_ = local_208;
            auVar27 = vpcmpeqd_avx(auVar52._0_16_,auVar13);
            auVar33 = auVar54._0_16_ ^ auVar27;
            if (auVar13 != (undefined1  [16])0x0) {
              auVar27 = auVar54._0_16_ ^ auVar27;
              auVar31 = vmaskmovps_avx(auVar27,*local_1b8);
              *(undefined1 (*) [16])(local_1c0 + 0xc0) = auVar31;
              auVar31 = vmaskmovps_avx(auVar27,local_1b8[1]);
              *(undefined1 (*) [16])(local_1c0 + 0xd0) = auVar31;
              auVar31 = vmaskmovps_avx(auVar27,local_1b8[2]);
              *(undefined1 (*) [16])(local_1c0 + 0xe0) = auVar31;
              auVar31 = vmaskmovps_avx(auVar27,local_1b8[3]);
              *(undefined1 (*) [16])(local_1c0 + 0xf0) = auVar31;
              auVar31 = vmaskmovps_avx(auVar27,local_1b8[4]);
              *(undefined1 (*) [16])(local_1c0 + 0x100) = auVar31;
              auVar31 = vmaskmovps_avx(auVar27,local_1b8[5]);
              *(undefined1 (*) [16])(local_1c0 + 0x110) = auVar31;
              auVar31 = vmaskmovps_avx(auVar27,local_1b8[6]);
              *(undefined1 (*) [16])(local_1c0 + 0x120) = auVar31;
              auVar31 = vmaskmovps_avx(auVar27,local_1b8[7]);
              *(undefined1 (*) [16])(local_1c0 + 0x130) = auVar31;
              auVar27 = vmaskmovps_avx(auVar27,local_1b8[8]);
              *(undefined1 (*) [16])(local_1c0 + 0x140) = auVar27;
              pRVar16 = local_1c0;
            }
          }
          if ((auVar55._0_16_ & auVar33) == (undefined1  [16])0x0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_218._0_4_;
          }
          *(undefined4 *)(local_228 + lVar20 * 4) = 0;
          uVar15 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar26._4_4_ = uVar15;
          auVar26._0_4_ = uVar15;
          auVar26._8_4_ = uVar15;
          auVar26._12_4_ = uVar15;
          auVar27 = vcmpps_avx(auVar46._0_16_,auVar26,2);
          local_228 = vandps_avx(auVar27,local_228);
        }
        if ((((local_228 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (local_228 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (local_228 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            -1 < local_228[0xf]) {
          return;
        }
        auVar27 = vblendvps_avx(auVar45._0_16_,auVar46._0_16_,local_228);
        auVar33 = vshufps_avx(auVar27,auVar27,0xb1);
        auVar33 = vminps_avx(auVar33,auVar27);
        auVar31 = vshufpd_avx(auVar33,auVar33,1);
        auVar33 = vminps_avx(auVar31,auVar33);
        auVar33 = vcmpps_avx(auVar27,auVar33,0);
        auVar31 = local_228 & auVar33;
        auVar27 = local_228;
        if ((((auVar31 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar31 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar31 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar31[0xf] < '\0') {
          auVar27 = vandps_avx(auVar33,local_228);
        }
        uVar15 = vmovmskps_avx(auVar27);
        uVar17 = CONCAT44((int)((ulong)pRVar16 >> 0x20),uVar15);
        lVar20 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
          }
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }